

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MakeVerboseFormat.cpp
# Opt level: O3

bool IsMeshInVerboseFormat(aiMesh *mesh)

{
  uint uVar1;
  ulong uVar2;
  aiFace *paVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> seen;
  allocator_type local_2d;
  value_type_conflict1 local_2c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  
  local_2c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_28,(ulong)mesh->mNumVertices,&local_2c,&local_2d);
  uVar4 = mesh->mNumFaces;
  bVar6 = true;
  if (uVar4 != 0) {
    uVar2 = 0;
    do {
      if (mesh->mFaces[uVar2].mNumIndices != 0) {
        paVar3 = mesh->mFaces + uVar2;
        uVar5 = 0;
        do {
          uVar4 = paVar3->mIndices[uVar5];
          uVar1 = local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar4];
          local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4] = uVar1 + 1;
          if (uVar1 + 1 == 2) {
            bVar6 = false;
            goto LAB_002fbbb8;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < paVar3->mNumIndices);
        uVar4 = mesh->mNumFaces;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar4);
  }
LAB_002fbbb8:
  if (local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return bVar6;
}

Assistant:

bool IsMeshInVerboseFormat(const aiMesh* mesh) {
    // avoid slow vector<bool> specialization
    std::vector<unsigned int> seen(mesh->mNumVertices,0);
    for(unsigned int i = 0; i < mesh->mNumFaces; ++i) {
        const aiFace& f = mesh->mFaces[i];
        for(unsigned int j = 0; j < f.mNumIndices; ++j) {
            if(++seen[f.mIndices[j]] == 2) {
                // found a duplicate index
                return false;
            }
        }
    }

    return true;
}